

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O3

void __thiscall
dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildCFG
          (GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *this,
          SubgraphInfo *subginfo)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  iterator iVar5;
  int iVar6;
  BasicBlock *succ;
  key_type local_38;
  
  p_Var3 = (subginfo->blocks)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      p_Var1 = p_Var3[2]._M_nxt;
      lVar4 = llvm::BasicBlock::getTerminator();
      if ((lVar4 != 0) && (iVar2 = llvm::Instruction::getNumSuccessors(), iVar2 != 0)) {
        iVar6 = 0;
        do {
          local_38 = (key_type)llvm::Instruction::getSuccessor((uint)lVar4);
          iVar5 = std::
                  _Hashtable<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(subginfo->blocks)._M_h,&local_38);
          ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
                    ((ElemWithEdges<dg::dda::RWBBlock> *)(p_Var1 + 1),
                     *(RWBBlock **)
                      ((long)iVar5.
                             super__Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false>
                             ._M_cur + 0x10));
          iVar6 = iVar6 + 1;
        } while (iVar2 != iVar6);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void buildCFG(SubgraphInfo &subginfo) {
        for (auto &it : subginfo.blocks) {
            auto llvmblk = it.first;
            auto *bblock = it.second;

            for (auto *succ : successors(llvmblk)) {
                auto succit = subginfo.blocks.find(succ);
                assert((succit != subginfo.blocks.end()) &&
                       "Do not have the block built");

                bblock->addSuccessor(succit->second);
            }
        }
    }